

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  RTCFilterFunctionN p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t k;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  bool bVar27;
  int iVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  undefined1 (*pauVar32) [32];
  long lVar33;
  ulong uVar34;
  undefined4 uVar35;
  ulong unaff_R12;
  uint uVar36;
  NodeRef root;
  long lVar37;
  ulong *puVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar43;
  float fVar54;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  float fVar55;
  float fVar56;
  undefined1 in_ZMM1 [64];
  undefined1 auVar53 [64];
  undefined1 extraout_var [56];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2cd1;
  ulong local_2cd0;
  RayK<8> *local_2cc8;
  long local_2cc0;
  long local_2cb8;
  RTCFilterFunctionNArguments local_2cb0;
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [40];
  BVH *local_2c18;
  Intersectors *local_2c10;
  ulong local_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  undefined1 local_2b80 [32];
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [8];
  float fStack_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  undefined1 local_2ac0 [8];
  float fStack_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  float fStack_2aa8;
  undefined1 local_2aa0 [8];
  float fStack_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float fStack_2a88;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined4 local_2a40;
  undefined4 uStack_2a3c;
  uint uStack_2a38;
  uint uStack_2a34;
  uint uStack_2a30;
  uint uStack_2a2c;
  uint uStack_2a28;
  uint uStack_2a24;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2a20;
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  float local_2900;
  float fStack_28fc;
  float fStack_28f8;
  float fStack_28f4;
  float fStack_28f0;
  float fStack_28ec;
  float fStack_28e8;
  undefined4 uStack_28e4;
  float local_28e0;
  float fStack_28dc;
  float fStack_28d8;
  float fStack_28d4;
  float fStack_28d0;
  float fStack_28cc;
  float fStack_28c8;
  undefined4 uStack_28c4;
  float local_28c0;
  float fStack_28bc;
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  undefined4 uStack_28a4;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2800;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined1 local_2780 [32];
  undefined1 local_2760 [8];
  float fStack_2758;
  float fStack_2754;
  float fStack_2750;
  float fStack_274c;
  float fStack_2748;
  undefined4 uStack_2744;
  undefined4 local_2740;
  undefined4 uStack_273c;
  undefined4 uStack_2738;
  undefined4 uStack_2734;
  undefined4 uStack_2730;
  undefined4 uStack_272c;
  undefined4 uStack_2728;
  undefined4 uStack_2724;
  uint local_2720;
  uint uStack_271c;
  uint uStack_2718;
  uint uStack_2714;
  uint uStack_2710;
  uint uStack_270c;
  uint uStack_2708;
  uint uStack_2704;
  uint local_2700;
  uint uStack_26fc;
  uint uStack_26f8;
  uint uStack_26f4;
  uint uStack_26f0;
  uint uStack_26ec;
  uint uStack_26e8;
  uint uStack_26e4;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_26e0;
  RTCRayQueryContext local_26c0 [4];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_26a0;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2c18 = (BVH *)This->ptr;
  local_2608 = (local_2c18->root).ptr;
  if (local_2608 != 8) {
    auVar66 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar57 = ZEXT816(0) << 0x40;
    auVar44 = vpcmpeqd_avx2(auVar66,(undefined1  [32])valid_i->field_0);
    auVar66 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar57),5);
    auVar45 = auVar44 & auVar66;
    if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar45 >> 0x7f,0) != '\0') ||
          (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar45 >> 0xbf,0) != '\0') ||
        (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar45[0x1f] < '\0')
    {
      auVar66 = vandps_avx(auVar66,auVar44);
      auVar3 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
      local_2a20._0_4_ = *(undefined4 *)ray;
      local_2a20._4_4_ = *(undefined4 *)(ray + 4);
      local_2a20._8_4_ = *(undefined4 *)(ray + 8);
      local_2a20._12_4_ = *(undefined4 *)(ray + 0xc);
      local_2a20._16_4_ = *(undefined4 *)(ray + 0x10);
      local_2a20._20_4_ = *(undefined4 *)(ray + 0x14);
      local_2a20._24_4_ = *(undefined4 *)(ray + 0x18);
      local_2a20._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_2a20._32_4_ = *(undefined4 *)(ray + 0x20);
      local_2a20._36_4_ = *(undefined4 *)(ray + 0x24);
      local_2a20._40_4_ = *(undefined4 *)(ray + 0x28);
      local_2a20._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_2a20._48_4_ = *(undefined4 *)(ray + 0x30);
      local_2a20._52_4_ = *(undefined4 *)(ray + 0x34);
      local_2a20._56_4_ = *(undefined4 *)(ray + 0x38);
      local_2a20._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_2a20._64_4_ = *(undefined4 *)(ray + 0x40);
      local_2a20._68_4_ = *(undefined4 *)(ray + 0x44);
      local_2a20._72_4_ = *(undefined4 *)(ray + 0x48);
      local_2a20._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_2a20._80_4_ = *(undefined4 *)(ray + 0x50);
      local_2a20._84_4_ = *(undefined4 *)(ray + 0x54);
      local_2a20._88_4_ = *(undefined4 *)(ray + 0x58);
      local_2a20._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_29c0 = *(undefined1 (*) [32])(ray + 0x80);
      local_29a0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2980 = *(undefined1 (*) [32])(ray + 0xc0);
      local_2b80._8_4_ = 0x7fffffff;
      local_2b80._0_8_ = 0x7fffffff7fffffff;
      local_2b80._12_4_ = 0x7fffffff;
      local_2b80._16_4_ = 0x7fffffff;
      local_2b80._20_4_ = 0x7fffffff;
      local_2b80._24_4_ = 0x7fffffff;
      local_2b80._28_4_ = 0x7fffffff;
      auVar94._8_4_ = 0x219392ef;
      auVar94._0_8_ = 0x219392ef219392ef;
      auVar94._12_4_ = 0x219392ef;
      auVar94._16_4_ = 0x219392ef;
      auVar94._20_4_ = 0x219392ef;
      auVar94._24_4_ = 0x219392ef;
      auVar94._28_4_ = 0x219392ef;
      auVar66 = vandps_avx(local_2b80,local_29c0);
      auVar66 = vcmpps_avx(auVar66,auVar94,1);
      auVar45 = vblendvps_avx(local_29c0,auVar94,auVar66);
      auVar66 = vandps_avx(local_2b80,local_29a0);
      auVar66 = vcmpps_avx(auVar66,auVar94,1);
      auVar44 = vblendvps_avx(local_29a0,auVar94,auVar66);
      auVar66 = vandps_avx(local_2980,local_2b80);
      auVar66 = vcmpps_avx(auVar66,auVar94,1);
      auVar66 = vblendvps_avx(local_2980,auVar94,auVar66);
      auVar65 = vrcpps_avx(auVar45);
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = 0x3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar95._16_4_ = 0x3f800000;
      auVar95._20_4_ = 0x3f800000;
      auVar95._24_4_ = 0x3f800000;
      auVar95._28_4_ = 0x3f800000;
      auVar14 = vfnmadd213ps_fma(auVar45,auVar65,auVar95);
      auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar65,auVar65);
      auVar45 = vrcpps_avx(auVar44);
      auVar15 = vfnmadd213ps_fma(auVar44,auVar45,auVar95);
      auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar45,auVar45);
      auVar45 = vrcpps_avx(auVar66);
      auVar16 = vfnmadd213ps_fma(auVar66,auVar45,auVar95);
      auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar45,auVar45);
      local_2960 = ZEXT1632(auVar14);
      local_2940 = ZEXT1632(auVar15);
      local_2920 = ZEXT1632(auVar16);
      local_2900 = auVar14._0_4_ * (float)local_2a20._0_4_;
      fStack_28fc = auVar14._4_4_ * (float)local_2a20._4_4_;
      fStack_28f8 = auVar14._8_4_ * (float)local_2a20._8_4_;
      fStack_28f4 = auVar14._12_4_ * (float)local_2a20._12_4_;
      fStack_28f0 = (float)local_2a20._16_4_ * 0.0;
      fStack_28ec = (float)local_2a20._20_4_ * 0.0;
      fStack_28e8 = (float)local_2a20._24_4_ * 0.0;
      local_28e0 = (float)local_2a20._32_4_ * auVar15._0_4_;
      fStack_28dc = (float)local_2a20._36_4_ * auVar15._4_4_;
      fStack_28d8 = (float)local_2a20._40_4_ * auVar15._8_4_;
      fStack_28d4 = (float)local_2a20._44_4_ * auVar15._12_4_;
      fStack_28d0 = (float)local_2a20._48_4_ * 0.0;
      fStack_28cc = (float)local_2a20._52_4_ * 0.0;
      fStack_28c8 = (float)local_2a20._56_4_ * 0.0;
      local_28c0 = (float)local_2a20._64_4_ * auVar16._0_4_;
      fStack_28bc = (float)local_2a20._68_4_ * auVar16._4_4_;
      fStack_28b8 = (float)local_2a20._72_4_ * auVar16._8_4_;
      fStack_28b4 = (float)local_2a20._76_4_ * auVar16._12_4_;
      fStack_28b0 = (float)local_2a20._80_4_ * 0.0;
      fStack_28ac = (float)local_2a20._84_4_ * 0.0;
      fStack_28a8 = (float)local_2a20._88_4_ * 0.0;
      auVar66 = vcmpps_avx(local_2960,ZEXT1632(auVar57),1);
      auVar45._8_4_ = 0x10;
      auVar45._0_8_ = 0x1000000010;
      auVar45._12_4_ = 0x10;
      auVar45._16_4_ = 0x10;
      auVar45._20_4_ = 0x10;
      auVar45._24_4_ = 0x10;
      auVar45._28_4_ = 0x10;
      local_28a0 = vandps_avx(auVar66,auVar45);
      auVar44._8_4_ = 0x20;
      auVar44._0_8_ = 0x2000000020;
      auVar44._12_4_ = 0x20;
      auVar44._16_4_ = 0x20;
      auVar44._20_4_ = 0x20;
      auVar44._24_4_ = 0x20;
      auVar44._28_4_ = 0x20;
      auVar72._8_4_ = 0x30;
      auVar72._0_8_ = 0x3000000030;
      auVar72._12_4_ = 0x30;
      auVar72._16_4_ = 0x30;
      auVar72._20_4_ = 0x30;
      auVar72._24_4_ = 0x30;
      auVar72._28_4_ = 0x30;
      auVar45 = ZEXT1632(auVar57);
      auVar66 = vcmpps_avx(ZEXT1632(auVar15),auVar45,5);
      local_2880 = vblendvps_avx(auVar72,auVar44,auVar66);
      auVar65._8_4_ = 0x40;
      auVar65._0_8_ = 0x4000000040;
      auVar65._12_4_ = 0x40;
      auVar65._16_4_ = 0x40;
      auVar65._20_4_ = 0x40;
      auVar65._24_4_ = 0x40;
      auVar65._28_4_ = 0x40;
      auVar73._8_4_ = 0x50;
      auVar73._0_8_ = 0x5000000050;
      auVar73._12_4_ = 0x50;
      auVar73._16_4_ = 0x50;
      auVar73._20_4_ = 0x50;
      auVar73._24_4_ = 0x50;
      auVar73._28_4_ = 0x50;
      auVar66 = vcmpps_avx(ZEXT1632(auVar16),auVar45,5);
      local_2860 = vblendvps_avx(auVar73,auVar65,auVar66);
      auVar66 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar45);
      auVar45 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar45);
      local_2a80 = vpmovsxwd_avx2(auVar3);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar101 = ZEXT3264(local_1e80);
      local_2840 = vblendvps_avx(local_1e80,auVar66,local_2a80);
      auVar66._8_4_ = 0xff800000;
      auVar66._0_8_ = 0xff800000ff800000;
      auVar66._12_4_ = 0xff800000;
      auVar66._16_4_ = 0xff800000;
      auVar66._20_4_ = 0xff800000;
      auVar66._24_4_ = 0xff800000;
      auVar66._28_4_ = 0xff800000;
      local_2820 = vblendvps_avx(auVar66,auVar45,local_2a80);
      auVar57 = vpcmpeqd_avx(local_2820._0_16_,local_2820._0_16_);
      local_2be0 = vpmovsxwd_avx2(auVar3 ^ auVar57);
      auVar53 = ZEXT3264(local_2be0);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar34 = 5;
      }
      else {
        uVar34 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2cc8 = ray + 0x100;
      puVar38 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar32 = (undefined1 (*) [32])local_1e40;
      local_1e60 = local_2840;
      local_2c00 = mm_lookupmask_ps._16_8_;
      uStack_2bf8 = mm_lookupmask_ps._24_8_;
      uStack_2bf0 = mm_lookupmask_ps._16_8_;
      uStack_2be8 = mm_lookupmask_ps._24_8_;
      local_2cd0 = uVar34;
      local_2c10 = This;
      uStack_28e4 = local_2a20._28_4_;
      uStack_28c4 = local_2a20._60_4_;
      uStack_28a4 = local_2a20._92_4_;
LAB_015ba887:
      do {
        do {
          root.ptr = puVar38[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_015bb3c5;
          puVar38 = puVar38 + -1;
          pauVar32 = pauVar32 + -1;
          local_2c40._0_32_ = *pauVar32;
          auVar103 = ZEXT3264(local_2c40._0_32_);
          auVar66 = vcmpps_avx(local_2c40._0_32_,local_2820,1);
        } while ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar66 >> 0x7f,0) == '\0') &&
                   (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar66 >> 0xbf,0) == '\0') &&
                 (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar66[0x1f]);
        uVar35 = vmovmskps_avx(auVar66);
        unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar35);
        if (uVar34 < CONCAT44(0,POPCOUNT(uVar35))) {
LAB_015ba8c4:
          do {
            iVar28 = 4;
            lVar31 = -0x10;
            uVar36 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_015bb3c5;
              auVar66 = vcmpps_avx(local_2820,auVar103._0_32_,6);
              if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar66 >> 0x7f,0) == '\0') &&
                    (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar66 >> 0xbf,0) == '\0') &&
                  (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar66[0x1f]) goto LAB_015ba887;
              lVar31 = (ulong)(uVar36 & 0xf) - 8;
              local_2a40 = local_2be0._0_4_;
              uStack_2a3c = local_2be0._4_4_;
              uStack_2a38 = local_2be0._8_4_;
              uStack_2a34 = local_2be0._12_4_;
              uStack_2a30 = local_2be0._16_4_;
              uStack_2a2c = local_2be0._20_4_;
              uStack_2a28 = local_2be0._24_4_;
              uStack_2a24 = local_2be0._28_4_;
              local_2bc0._0_8_ = local_2be0._0_8_ ^ 0xffffffffffffffff;
              local_2bc0._8_4_ = local_2be0._8_4_ ^ 0xffffffff;
              local_2bc0._12_4_ = local_2be0._12_4_ ^ 0xffffffff;
              local_2bc0._16_4_ = local_2be0._16_4_ ^ 0xffffffff;
              local_2bc0._20_4_ = local_2be0._20_4_ ^ 0xffffffff;
              local_2bc0._24_4_ = local_2be0._24_4_ ^ 0xffffffff;
              local_2bc0._28_4_ = local_2be0._28_4_ ^ 0xffffffff;
              lVar37 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              lVar33 = 0;
              goto LAB_015bab7e;
            }
            uVar29 = root.ptr & 0xfffffffffffffff0;
            auVar66 = vcmpps_avx(local_2820,auVar103._0_32_,6);
            root.ptr = 8;
            auVar45 = auVar101._0_32_;
            for (; (auVar103 = ZEXT3264(auVar45), lVar31 != 0 &&
                   (uVar30 = *(ulong *)(uVar29 + 0x20 + lVar31 * 2), uVar30 != 8));
                lVar31 = lVar31 + 4) {
              uVar35 = *(undefined4 *)(uVar29 + 0x90 + lVar31);
              auVar67._4_4_ = uVar35;
              auVar67._0_4_ = uVar35;
              auVar67._8_4_ = uVar35;
              auVar67._12_4_ = uVar35;
              auVar67._16_4_ = uVar35;
              auVar67._20_4_ = uVar35;
              auVar67._24_4_ = uVar35;
              auVar67._28_4_ = uVar35;
              uVar35 = *(undefined4 *)(uVar29 + 0x30 + lVar31);
              auVar58._4_4_ = uVar35;
              auVar58._0_4_ = uVar35;
              auVar58._8_4_ = uVar35;
              auVar58._12_4_ = uVar35;
              auVar58._16_4_ = uVar35;
              auVar58._20_4_ = uVar35;
              auVar58._24_4_ = uVar35;
              auVar58._28_4_ = uVar35;
              auVar44 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar35 = *(undefined4 *)(uVar29 + 0xb0 + lVar31);
              auVar74._4_4_ = uVar35;
              auVar74._0_4_ = uVar35;
              auVar74._8_4_ = uVar35;
              auVar74._12_4_ = uVar35;
              auVar74._16_4_ = uVar35;
              auVar74._20_4_ = uVar35;
              auVar74._24_4_ = uVar35;
              auVar74._28_4_ = uVar35;
              auVar57 = vfmadd231ps_fma(auVar58,auVar44,auVar67);
              uVar35 = *(undefined4 *)(uVar29 + 0x50 + lVar31);
              auVar68._4_4_ = uVar35;
              auVar68._0_4_ = uVar35;
              auVar68._8_4_ = uVar35;
              auVar68._12_4_ = uVar35;
              auVar68._16_4_ = uVar35;
              auVar68._20_4_ = uVar35;
              auVar68._24_4_ = uVar35;
              auVar68._28_4_ = uVar35;
              auVar3 = vfmadd231ps_fma(auVar68,auVar44,auVar74);
              uVar35 = *(undefined4 *)(uVar29 + 0xd0 + lVar31);
              auVar77._4_4_ = uVar35;
              auVar77._0_4_ = uVar35;
              auVar77._8_4_ = uVar35;
              auVar77._12_4_ = uVar35;
              auVar77._16_4_ = uVar35;
              auVar77._20_4_ = uVar35;
              auVar77._24_4_ = uVar35;
              auVar77._28_4_ = uVar35;
              uVar35 = *(undefined4 *)(uVar29 + 0x70 + lVar31);
              auVar75._4_4_ = uVar35;
              auVar75._0_4_ = uVar35;
              auVar75._8_4_ = uVar35;
              auVar75._12_4_ = uVar35;
              auVar75._16_4_ = uVar35;
              auVar75._20_4_ = uVar35;
              auVar75._24_4_ = uVar35;
              auVar75._28_4_ = uVar35;
              uVar35 = *(undefined4 *)(uVar29 + 0xa0 + lVar31);
              auVar84._4_4_ = uVar35;
              auVar84._0_4_ = uVar35;
              auVar84._8_4_ = uVar35;
              auVar84._12_4_ = uVar35;
              auVar84._16_4_ = uVar35;
              auVar84._20_4_ = uVar35;
              auVar84._24_4_ = uVar35;
              auVar84._28_4_ = uVar35;
              uVar35 = *(undefined4 *)(uVar29 + 0x40 + lVar31);
              auVar81._4_4_ = uVar35;
              auVar81._0_4_ = uVar35;
              auVar81._8_4_ = uVar35;
              auVar81._12_4_ = uVar35;
              auVar81._16_4_ = uVar35;
              auVar81._20_4_ = uVar35;
              auVar81._24_4_ = uVar35;
              auVar81._28_4_ = uVar35;
              auVar14 = vfmadd231ps_fma(auVar75,auVar44,auVar77);
              auVar15 = vfmadd231ps_fma(auVar81,auVar44,auVar84);
              uVar35 = *(undefined4 *)(uVar29 + 0xc0 + lVar31);
              auVar78._4_4_ = uVar35;
              auVar78._0_4_ = uVar35;
              auVar78._8_4_ = uVar35;
              auVar78._12_4_ = uVar35;
              auVar78._16_4_ = uVar35;
              auVar78._20_4_ = uVar35;
              auVar78._24_4_ = uVar35;
              auVar78._28_4_ = uVar35;
              uVar35 = *(undefined4 *)(uVar29 + 0x60 + lVar31);
              auVar85._4_4_ = uVar35;
              auVar85._0_4_ = uVar35;
              auVar85._8_4_ = uVar35;
              auVar85._12_4_ = uVar35;
              auVar85._16_4_ = uVar35;
              auVar85._20_4_ = uVar35;
              auVar85._24_4_ = uVar35;
              auVar85._28_4_ = uVar35;
              uVar35 = *(undefined4 *)(uVar29 + 0xe0 + lVar31);
              auVar88._4_4_ = uVar35;
              auVar88._0_4_ = uVar35;
              auVar88._8_4_ = uVar35;
              auVar88._12_4_ = uVar35;
              auVar88._16_4_ = uVar35;
              auVar88._20_4_ = uVar35;
              auVar88._24_4_ = uVar35;
              auVar88._28_4_ = uVar35;
              auVar16 = vfmadd231ps_fma(auVar85,auVar44,auVar78);
              uVar35 = *(undefined4 *)(uVar29 + 0x80 + lVar31);
              auVar92._4_4_ = uVar35;
              auVar92._0_4_ = uVar35;
              auVar92._8_4_ = uVar35;
              auVar92._12_4_ = uVar35;
              auVar92._16_4_ = uVar35;
              auVar92._20_4_ = uVar35;
              auVar92._24_4_ = uVar35;
              auVar92._28_4_ = uVar35;
              auVar10 = vfmadd231ps_fma(auVar92,auVar44,auVar88);
              auVar24._4_4_ = fStack_28fc;
              auVar24._0_4_ = local_2900;
              auVar24._8_4_ = fStack_28f8;
              auVar24._12_4_ = fStack_28f4;
              auVar24._16_4_ = fStack_28f0;
              auVar24._20_4_ = fStack_28ec;
              auVar24._24_4_ = fStack_28e8;
              auVar24._28_4_ = uStack_28e4;
              auVar57 = vfmsub213ps_fma(ZEXT1632(auVar57),local_2960,auVar24);
              auVar25._4_4_ = fStack_28dc;
              auVar25._0_4_ = local_28e0;
              auVar25._8_4_ = fStack_28d8;
              auVar25._12_4_ = fStack_28d4;
              auVar25._16_4_ = fStack_28d0;
              auVar25._20_4_ = fStack_28cc;
              auVar25._24_4_ = fStack_28c8;
              auVar25._28_4_ = uStack_28c4;
              auVar3 = vfmsub213ps_fma(ZEXT1632(auVar3),local_2940,auVar25);
              auVar26._4_4_ = fStack_28bc;
              auVar26._0_4_ = local_28c0;
              auVar26._8_4_ = fStack_28b8;
              auVar26._12_4_ = fStack_28b4;
              auVar26._16_4_ = fStack_28b0;
              auVar26._20_4_ = fStack_28ac;
              auVar26._24_4_ = fStack_28a8;
              auVar26._28_4_ = uStack_28a4;
              auVar14 = vfmsub213ps_fma(ZEXT1632(auVar14),local_2920,auVar26);
              auVar15 = vfmsub213ps_fma(ZEXT1632(auVar15),local_2960,auVar24);
              auVar16 = vfmsub213ps_fma(ZEXT1632(auVar16),local_2940,auVar25);
              auVar10 = vfmsub213ps_fma(ZEXT1632(auVar10),local_2920,auVar26);
              auVar65 = vpminsd_avx2(ZEXT1632(auVar57),ZEXT1632(auVar15));
              auVar72 = vpminsd_avx2(ZEXT1632(auVar3),ZEXT1632(auVar16));
              auVar65 = vpmaxsd_avx2(auVar65,auVar72);
              auVar72 = vpminsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar10));
              auVar72 = vpmaxsd_avx2(auVar65,auVar72);
              auVar65 = vpmaxsd_avx2(ZEXT1632(auVar57),ZEXT1632(auVar15));
              auVar73 = vpmaxsd_avx2(ZEXT1632(auVar3),ZEXT1632(auVar16));
              auVar73 = vpminsd_avx2(auVar65,auVar73);
              auVar65 = vpmaxsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar10));
              auVar73 = vpminsd_avx2(auVar73,auVar65);
              auVar65 = vpmaxsd_avx2(auVar72,local_2840);
              auVar73 = vpminsd_avx2(auVar73,local_2820);
              auVar65 = vcmpps_avx(auVar65,auVar73,2);
              if ((uVar36 & 7) == 6) {
                uVar35 = *(undefined4 *)(uVar29 + 0xf0 + lVar31);
                auVar69._4_4_ = uVar35;
                auVar69._0_4_ = uVar35;
                auVar69._8_4_ = uVar35;
                auVar69._12_4_ = uVar35;
                auVar69._16_4_ = uVar35;
                auVar69._20_4_ = uVar35;
                auVar69._24_4_ = uVar35;
                auVar69._28_4_ = uVar35;
                auVar73 = vcmpps_avx(auVar69,auVar44,2);
                uVar35 = *(undefined4 *)(uVar29 + 0x100 + lVar31);
                auVar76._4_4_ = uVar35;
                auVar76._0_4_ = uVar35;
                auVar76._8_4_ = uVar35;
                auVar76._12_4_ = uVar35;
                auVar76._16_4_ = uVar35;
                auVar76._20_4_ = uVar35;
                auVar76._24_4_ = uVar35;
                auVar76._28_4_ = uVar35;
                auVar44 = vcmpps_avx(auVar44,auVar76,1);
                auVar44 = vandps_avx(auVar73,auVar44);
                auVar44 = vandps_avx(auVar44,auVar65);
                auVar57 = vpackssdw_avx(auVar44._0_16_,auVar44._16_16_);
              }
              else {
                auVar57 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
              }
              auVar3 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
              auVar57 = vpand_avx(auVar57,auVar3);
              auVar44 = vpmovzxwd_avx2(auVar57);
              auVar44 = vpslld_avx2(auVar44,0x1f);
              if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar44 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar44 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar44 >> 0x7f,0) == '\0') &&
                    (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar44 >> 0xbf,0) == '\0') &&
                  (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar44[0x1f]) {
                auVar53 = ZEXT3264(auVar45);
                uVar30 = root.ptr;
              }
              else {
                auVar44 = vblendvps_avx(auVar101._0_32_,auVar72,auVar44);
                auVar53 = ZEXT3264(auVar44);
                if (root.ptr != 8) {
                  *puVar38 = root.ptr;
                  puVar38 = puVar38 + 1;
                  *pauVar32 = auVar45;
                  pauVar32 = pauVar32 + 1;
                }
              }
              auVar45 = auVar53._0_32_;
              root.ptr = uVar30;
            }
            if (root.ptr == 8) goto LAB_015bab09;
            auVar66 = vcmpps_avx(local_2820,auVar45,6);
            uVar35 = vmovmskps_avx(auVar66);
          } while ((byte)uVar34 < (byte)POPCOUNT(uVar35));
          *puVar38 = root.ptr;
          puVar38 = puVar38 + 1;
          *pauVar32 = auVar45;
          pauVar32 = pauVar32 + 1;
        }
        else {
          local_2c80._0_8_ = CONCAT44(0,POPCOUNT(uVar35));
          while (unaff_R12 != 0) {
            k = 0;
            for (uVar34 = unaff_R12; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            unaff_R12 = unaff_R12 - 1 & unaff_R12;
            local_2c60._0_8_ = k;
            auVar53 = ZEXT1664(auVar53._0_16_);
            bVar27 = occluded1(local_2c10,local_2c18,root,k,&local_2cd1,ray,
                               (TravRayK<8,_false> *)&local_2a20.field_0,context);
            uVar34 = local_2cd0;
            if (bVar27) {
              *(undefined4 *)(local_2be0 + local_2c60._0_8_ * 4) = 0xffffffff;
            }
          }
          auVar66 = _DAT_01f7b020 & ~local_2be0;
          iVar28 = 3;
          auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar103 = ZEXT3264(local_2c40._0_32_);
          if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar66 >> 0x7f,0) != '\0') ||
                (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar66 >> 0xbf,0) != '\0') ||
              (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar66[0x1f] < '\0') {
            auVar53 = ZEXT3264(local_2820);
            auVar64._8_4_ = 0xff800000;
            auVar64._0_8_ = 0xff800000ff800000;
            auVar64._12_4_ = 0xff800000;
            auVar64._16_4_ = 0xff800000;
            auVar64._20_4_ = 0xff800000;
            auVar64._24_4_ = 0xff800000;
            auVar64._28_4_ = 0xff800000;
            local_2820 = vblendvps_avx(local_2820,auVar64,local_2be0);
            iVar28 = 2;
          }
          unaff_R12 = 0;
          if ((uint)uVar34 < (uint)local_2c80._0_4_) goto LAB_015ba8c4;
        }
LAB_015bab09:
      } while ((iVar28 == 4) || (iVar28 == 2));
LAB_015bb3c5:
      auVar66 = vandps_avx(local_2a80,local_2be0);
      auVar52._8_4_ = 0xff800000;
      auVar52._0_8_ = 0xff800000ff800000;
      auVar52._12_4_ = 0xff800000;
      auVar52._16_4_ = 0xff800000;
      auVar52._20_4_ = 0xff800000;
      auVar52._24_4_ = 0xff800000;
      auVar52._28_4_ = 0xff800000;
      auVar66 = vmaskmovps_avx(auVar66,auVar52);
      *(undefined1 (*) [32])local_2cc8 = auVar66;
    }
  }
  return;
LAB_015bab7e:
  do {
    uVar29 = 0xfffffffffffffff0;
    auVar45 = auVar53._0_32_;
    auVar66 = local_2bc0;
    if (lVar33 == lVar31) break;
    do {
      if ((uVar29 == 0) || (uVar30 = (ulong)*(uint *)(lVar37 + uVar29), uVar30 == 0xffffffff))
      break;
      auVar45 = *(undefined1 (*) [32])(ray + 0x80);
      auVar44 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar65 = *(undefined1 (*) [32])(ray + 0xe0);
      uVar35 = *(undefined4 *)(lVar37 + -0x90 + uVar29);
      auVar46._4_4_ = uVar35;
      auVar46._0_4_ = uVar35;
      auVar46._8_4_ = uVar35;
      auVar46._12_4_ = uVar35;
      auVar46._16_4_ = uVar35;
      auVar46._20_4_ = uVar35;
      auVar46._24_4_ = uVar35;
      auVar46._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar37 + -0x80 + uVar29);
      auVar59._4_4_ = uVar35;
      auVar59._0_4_ = uVar35;
      auVar59._8_4_ = uVar35;
      auVar59._12_4_ = uVar35;
      auVar59._16_4_ = uVar35;
      auVar59._20_4_ = uVar35;
      auVar59._24_4_ = uVar35;
      auVar59._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar37 + -0x70 + uVar29);
      auVar86._4_4_ = uVar35;
      auVar86._0_4_ = uVar35;
      auVar86._8_4_ = uVar35;
      auVar86._12_4_ = uVar35;
      auVar86._16_4_ = uVar35;
      auVar86._20_4_ = uVar35;
      auVar86._24_4_ = uVar35;
      auVar86._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar37 + -0x120 + uVar29);
      auVar79._4_4_ = uVar35;
      auVar79._0_4_ = uVar35;
      auVar79._8_4_ = uVar35;
      auVar79._12_4_ = uVar35;
      auVar79._16_4_ = uVar35;
      auVar79._20_4_ = uVar35;
      auVar79._24_4_ = uVar35;
      auVar79._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar37 + -0x110 + uVar29);
      auVar82._4_4_ = uVar35;
      auVar82._0_4_ = uVar35;
      auVar82._8_4_ = uVar35;
      auVar82._12_4_ = uVar35;
      auVar82._16_4_ = uVar35;
      auVar82._20_4_ = uVar35;
      auVar82._24_4_ = uVar35;
      auVar82._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar37 + -0x100 + uVar29);
      auVar96._4_4_ = uVar35;
      auVar96._0_4_ = uVar35;
      auVar96._8_4_ = uVar35;
      auVar96._12_4_ = uVar35;
      auVar96._16_4_ = uVar35;
      auVar96._20_4_ = uVar35;
      auVar96._24_4_ = uVar35;
      auVar96._28_4_ = uVar35;
      auVar57 = vfmadd231ps_fma(auVar79,auVar65,auVar46);
      auVar3 = vfmadd231ps_fma(auVar82,auVar65,auVar59);
      uVar35 = *(undefined4 *)(lVar37 + -0x60 + uVar29);
      auVar47._4_4_ = uVar35;
      auVar47._0_4_ = uVar35;
      auVar47._8_4_ = uVar35;
      auVar47._12_4_ = uVar35;
      auVar47._16_4_ = uVar35;
      auVar47._20_4_ = uVar35;
      auVar47._24_4_ = uVar35;
      auVar47._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar37 + -0x50 + uVar29);
      auVar60._4_4_ = uVar35;
      auVar60._0_4_ = uVar35;
      auVar60._8_4_ = uVar35;
      auVar60._12_4_ = uVar35;
      auVar60._16_4_ = uVar35;
      auVar60._20_4_ = uVar35;
      auVar60._24_4_ = uVar35;
      auVar60._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar37 + -0x40 + uVar29);
      auVar89._4_4_ = uVar35;
      auVar89._0_4_ = uVar35;
      auVar89._8_4_ = uVar35;
      auVar89._12_4_ = uVar35;
      auVar89._16_4_ = uVar35;
      auVar89._20_4_ = uVar35;
      auVar89._24_4_ = uVar35;
      auVar89._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar37 + -0xf0 + uVar29);
      auVar93._4_4_ = uVar35;
      auVar93._0_4_ = uVar35;
      auVar93._8_4_ = uVar35;
      auVar93._12_4_ = uVar35;
      auVar93._16_4_ = uVar35;
      auVar93._20_4_ = uVar35;
      auVar93._24_4_ = uVar35;
      auVar93._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar37 + -0xe0 + uVar29);
      auVar97._4_4_ = uVar35;
      auVar97._0_4_ = uVar35;
      auVar97._8_4_ = uVar35;
      auVar97._12_4_ = uVar35;
      auVar97._16_4_ = uVar35;
      auVar97._20_4_ = uVar35;
      auVar97._24_4_ = uVar35;
      auVar97._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar37 + -0xd0 + uVar29);
      auVar98._4_4_ = uVar35;
      auVar98._0_4_ = uVar35;
      auVar98._8_4_ = uVar35;
      auVar98._12_4_ = uVar35;
      auVar98._16_4_ = uVar35;
      auVar98._20_4_ = uVar35;
      auVar98._24_4_ = uVar35;
      auVar98._28_4_ = uVar35;
      auVar14 = vfmadd231ps_fma(auVar96,auVar65,auVar86);
      auVar15 = vfmadd231ps_fma(auVar93,auVar65,auVar47);
      auVar16 = vfmadd231ps_fma(auVar97,auVar65,auVar60);
      auVar10 = vfmadd231ps_fma(auVar98,auVar65,auVar89);
      uVar35 = *(undefined4 *)(lVar37 + -0x30 + uVar29);
      auVar48._4_4_ = uVar35;
      auVar48._0_4_ = uVar35;
      auVar48._8_4_ = uVar35;
      auVar48._12_4_ = uVar35;
      auVar48._16_4_ = uVar35;
      auVar48._20_4_ = uVar35;
      auVar48._24_4_ = uVar35;
      auVar48._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar37 + -0x20 + uVar29);
      auVar61._4_4_ = uVar35;
      auVar61._0_4_ = uVar35;
      auVar61._8_4_ = uVar35;
      auVar61._12_4_ = uVar35;
      auVar61._16_4_ = uVar35;
      auVar61._20_4_ = uVar35;
      auVar61._24_4_ = uVar35;
      auVar61._28_4_ = uVar35;
      uVar35 = *(undefined4 *)(lVar37 + -0x10 + uVar29);
      auVar87._4_4_ = uVar35;
      auVar87._0_4_ = uVar35;
      auVar87._8_4_ = uVar35;
      auVar87._12_4_ = uVar35;
      auVar87._16_4_ = uVar35;
      auVar87._20_4_ = uVar35;
      auVar87._24_4_ = uVar35;
      auVar87._28_4_ = uVar35;
      uVar1 = *(undefined4 *)(lVar37 + -0xc0 + uVar29);
      auVar100._4_4_ = uVar1;
      auVar100._0_4_ = uVar1;
      auVar100._8_4_ = uVar1;
      auVar100._12_4_ = uVar1;
      auVar100._16_4_ = uVar1;
      auVar100._20_4_ = uVar1;
      auVar100._24_4_ = uVar1;
      auVar100._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar37 + -0xb0 + uVar29);
      auVar102._4_4_ = uVar1;
      auVar102._0_4_ = uVar1;
      auVar102._8_4_ = uVar1;
      auVar102._12_4_ = uVar1;
      auVar102._16_4_ = uVar1;
      auVar102._20_4_ = uVar1;
      auVar102._24_4_ = uVar1;
      auVar102._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(lVar37 + -0xa0 + uVar29);
      auVar90._4_4_ = uVar1;
      auVar90._0_4_ = uVar1;
      auVar90._8_4_ = uVar1;
      auVar90._12_4_ = uVar1;
      auVar90._16_4_ = uVar1;
      auVar90._20_4_ = uVar1;
      auVar90._24_4_ = uVar1;
      auVar90._28_4_ = uVar1;
      auVar72 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar11 = vfmadd231ps_fma(auVar100,auVar65,auVar48);
      auVar12 = vfmadd231ps_fma(auVar102,auVar65,auVar61);
      auVar13 = vfmadd231ps_fma(auVar90,auVar65,auVar87);
      auVar65 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar15));
      auVar73 = vsubps_avx(ZEXT1632(auVar3),ZEXT1632(auVar16));
      auVar94 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar10));
      auVar95 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar57));
      auVar64 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar3));
      auVar46 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
      auVar91._0_4_ = auVar73._0_4_ * auVar46._0_4_;
      auVar91._4_4_ = auVar73._4_4_ * auVar46._4_4_;
      auVar91._8_4_ = auVar73._8_4_ * auVar46._8_4_;
      auVar91._12_4_ = auVar73._12_4_ * auVar46._12_4_;
      auVar91._16_4_ = auVar73._16_4_ * auVar46._16_4_;
      auVar91._20_4_ = auVar73._20_4_ * auVar46._20_4_;
      auVar91._24_4_ = auVar73._24_4_ * auVar46._24_4_;
      auVar91._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar91,auVar64,auVar94);
      auVar99._0_4_ = auVar94._0_4_ * auVar95._0_4_;
      auVar99._4_4_ = auVar94._4_4_ * auVar95._4_4_;
      auVar99._8_4_ = auVar94._8_4_ * auVar95._8_4_;
      auVar99._12_4_ = auVar94._12_4_ * auVar95._12_4_;
      auVar99._16_4_ = auVar94._16_4_ * auVar95._16_4_;
      auVar99._20_4_ = auVar94._20_4_ * auVar95._20_4_;
      auVar99._24_4_ = auVar94._24_4_ * auVar95._24_4_;
      auVar99._28_4_ = 0;
      auVar16 = vfmsub231ps_fma(auVar99,auVar46,auVar65);
      auVar4._4_4_ = auVar64._4_4_ * auVar65._4_4_;
      auVar4._0_4_ = auVar64._0_4_ * auVar65._0_4_;
      auVar4._8_4_ = auVar64._8_4_ * auVar65._8_4_;
      auVar4._12_4_ = auVar64._12_4_ * auVar65._12_4_;
      auVar4._16_4_ = auVar64._16_4_ * auVar65._16_4_;
      auVar4._20_4_ = auVar64._20_4_ * auVar65._20_4_;
      auVar4._24_4_ = auVar64._24_4_ * auVar65._24_4_;
      auVar4._28_4_ = uVar35;
      auVar10 = vfmsub231ps_fma(auVar4,auVar95,auVar73);
      auVar4 = vsubps_avx(ZEXT1632(auVar57),*(undefined1 (*) [32])ray);
      auVar47 = vsubps_avx(ZEXT1632(auVar3),*(undefined1 (*) [32])(ray + 0x20));
      auVar48 = vsubps_avx(ZEXT1632(auVar14),*(undefined1 (*) [32])(ray + 0x40));
      auVar17._4_4_ = auVar45._4_4_ * auVar47._4_4_;
      auVar17._0_4_ = auVar45._0_4_ * auVar47._0_4_;
      auVar17._8_4_ = auVar45._8_4_ * auVar47._8_4_;
      auVar17._12_4_ = auVar45._12_4_ * auVar47._12_4_;
      auVar17._16_4_ = auVar45._16_4_ * auVar47._16_4_;
      auVar17._20_4_ = auVar45._20_4_ * auVar47._20_4_;
      auVar17._24_4_ = auVar45._24_4_ * auVar47._24_4_;
      auVar17._28_4_ = auVar65._28_4_;
      auVar14 = vfmsub231ps_fma(auVar17,auVar4,auVar44);
      auVar83._0_4_ = auVar72._0_4_ * auVar10._0_4_;
      auVar83._4_4_ = auVar72._4_4_ * auVar10._4_4_;
      auVar83._8_4_ = auVar72._8_4_ * auVar10._8_4_;
      auVar83._12_4_ = auVar72._12_4_ * auVar10._12_4_;
      auVar83._16_4_ = auVar72._16_4_ * 0.0;
      auVar83._20_4_ = auVar72._20_4_ * 0.0;
      auVar83._24_4_ = auVar72._24_4_ * 0.0;
      auVar83._28_4_ = 0;
      auVar57 = vfmadd231ps_fma(auVar83,ZEXT1632(auVar16),auVar44);
      auVar18._4_4_ = auVar48._4_4_ * auVar44._4_4_;
      auVar18._0_4_ = auVar48._0_4_ * auVar44._0_4_;
      auVar18._8_4_ = auVar48._8_4_ * auVar44._8_4_;
      auVar18._12_4_ = auVar48._12_4_ * auVar44._12_4_;
      auVar18._16_4_ = auVar48._16_4_ * auVar44._16_4_;
      auVar18._20_4_ = auVar48._20_4_ * auVar44._20_4_;
      auVar18._24_4_ = auVar48._24_4_ * auVar44._24_4_;
      auVar18._28_4_ = auVar44._28_4_;
      auVar11 = vfmsub231ps_fma(auVar18,auVar47,auVar72);
      auVar19._4_4_ = auVar72._4_4_ * auVar4._4_4_;
      auVar19._0_4_ = auVar72._0_4_ * auVar4._0_4_;
      auVar19._8_4_ = auVar72._8_4_ * auVar4._8_4_;
      auVar19._12_4_ = auVar72._12_4_ * auVar4._12_4_;
      auVar19._16_4_ = auVar72._16_4_ * auVar4._16_4_;
      auVar19._20_4_ = auVar72._20_4_ * auVar4._20_4_;
      auVar19._24_4_ = auVar72._24_4_ * auVar4._24_4_;
      auVar19._28_4_ = auVar72._28_4_;
      auVar12 = vfmsub231ps_fma(auVar19,auVar48,auVar45);
      auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),ZEXT1632(auVar15),auVar45);
      auVar20._4_4_ = auVar46._4_4_ * auVar14._4_4_;
      auVar20._0_4_ = auVar46._0_4_ * auVar14._0_4_;
      auVar20._8_4_ = auVar46._8_4_ * auVar14._8_4_;
      auVar20._12_4_ = auVar46._12_4_ * auVar14._12_4_;
      auVar20._16_4_ = auVar46._16_4_ * 0.0;
      auVar20._20_4_ = auVar46._20_4_ * 0.0;
      auVar20._24_4_ = auVar46._24_4_ * 0.0;
      auVar20._28_4_ = auVar46._28_4_;
      auVar3 = vfmadd231ps_fma(auVar20,ZEXT1632(auVar12),auVar64);
      auVar70._8_4_ = 0x80000000;
      auVar70._0_8_ = 0x8000000080000000;
      auVar70._12_4_ = 0x80000000;
      auVar70._16_4_ = 0x80000000;
      auVar70._20_4_ = 0x80000000;
      auVar70._24_4_ = 0x80000000;
      auVar70._28_4_ = 0x80000000;
      auVar45 = vandps_avx(ZEXT1632(auVar57),auVar70);
      auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),ZEXT1632(auVar11),auVar95);
      uVar36 = auVar45._0_4_;
      auVar49._0_4_ = auVar3._0_4_ ^ uVar36;
      uVar5 = auVar45._4_4_;
      auVar49._4_4_ = auVar3._4_4_ ^ uVar5;
      uVar6 = auVar45._8_4_;
      auVar49._8_4_ = auVar3._8_4_ ^ uVar6;
      uVar7 = auVar45._12_4_;
      auVar49._12_4_ = auVar3._12_4_ ^ uVar7;
      uVar35 = auVar45._16_4_;
      auVar49._16_4_ = uVar35;
      uVar1 = auVar45._20_4_;
      auVar49._20_4_ = uVar1;
      uVar8 = auVar45._24_4_;
      auVar49._24_4_ = uVar8;
      uVar9 = auVar45._28_4_;
      auVar49._28_4_ = uVar9;
      auVar45 = vcmpps_avx(auVar49,ZEXT832(0) << 0x20,5);
      auVar44 = auVar66 & auVar45;
      if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar44 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar44 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar44 >> 0x7f,0) == '\0') &&
            (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar44 >> 0xbf,0) == '\0') &&
          (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar44[0x1f])
      {
LAB_015bad5a:
        auVar71._8_8_ = uStack_2bf8;
        auVar71._0_8_ = local_2c00;
        auVar71._16_8_ = uStack_2bf0;
        auVar71._24_8_ = uStack_2be8;
      }
      else {
        auVar45 = vandps_avx(auVar45,auVar66);
        auVar40._0_4_ = auVar94._0_4_ * auVar14._0_4_;
        auVar40._4_4_ = auVar94._4_4_ * auVar14._4_4_;
        auVar40._8_4_ = auVar94._8_4_ * auVar14._8_4_;
        auVar40._12_4_ = auVar94._12_4_ * auVar14._12_4_;
        auVar40._16_4_ = auVar94._16_4_ * 0.0;
        auVar40._20_4_ = auVar94._20_4_ * 0.0;
        auVar40._24_4_ = auVar94._24_4_ * 0.0;
        auVar40._28_4_ = 0;
        auVar3 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar73,auVar40);
        auVar3 = vfmadd132ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar3),auVar65);
        auVar50._0_4_ = uVar36 ^ auVar3._0_4_;
        auVar50._4_4_ = uVar5 ^ auVar3._4_4_;
        auVar50._8_4_ = uVar6 ^ auVar3._8_4_;
        auVar50._12_4_ = uVar7 ^ auVar3._12_4_;
        auVar50._16_4_ = uVar35;
        auVar50._20_4_ = uVar1;
        auVar50._24_4_ = uVar8;
        auVar50._28_4_ = uVar9;
        auVar44 = vcmpps_avx(auVar50,ZEXT832(0) << 0x20,5);
        auVar72 = auVar45 & auVar44;
        local_2c80 = auVar49;
        if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar72 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar72 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar72 >> 0x7f,0) == '\0') &&
              (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar72 >> 0xbf,0) == '\0') &&
            (auVar72 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar72[0x1f]) goto LAB_015bad5a;
        auVar72 = vandps_avx(ZEXT1632(auVar57),local_2b80);
        auVar45 = vandps_avx(auVar45,auVar44);
        auVar44 = vsubps_avx(auVar72,auVar49);
        auVar44 = vcmpps_avx(auVar44,auVar50,5);
        auVar73 = auVar45 & auVar44;
        if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar73 >> 0x7f,0) == '\0') &&
              (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar73 >> 0xbf,0) == '\0') &&
            (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar73[0x1f]) goto LAB_015bad5a;
        auVar44 = vandps_avx(auVar44,auVar45);
        auVar21._4_4_ = auVar48._4_4_ * auVar10._4_4_;
        auVar21._0_4_ = auVar48._0_4_ * auVar10._0_4_;
        auVar21._8_4_ = auVar48._8_4_ * auVar10._8_4_;
        auVar21._12_4_ = auVar48._12_4_ * auVar10._12_4_;
        auVar21._16_4_ = auVar48._16_4_ * 0.0;
        auVar21._20_4_ = auVar48._20_4_ * 0.0;
        auVar21._24_4_ = auVar48._24_4_ * 0.0;
        auVar21._28_4_ = auVar45._28_4_;
        auVar3 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar16),auVar21);
        auVar3 = vfmadd213ps_fma(auVar4,ZEXT1632(auVar15),ZEXT1632(auVar3));
        auVar41._0_4_ = uVar36 ^ auVar3._0_4_;
        auVar41._4_4_ = uVar5 ^ auVar3._4_4_;
        auVar41._8_4_ = uVar6 ^ auVar3._8_4_;
        auVar41._12_4_ = uVar7 ^ auVar3._12_4_;
        auVar41._16_4_ = uVar35;
        auVar41._20_4_ = uVar1;
        auVar41._24_4_ = uVar8;
        auVar41._28_4_ = uVar9;
        auVar22._4_4_ = auVar72._4_4_ * *(float *)(ray + 100);
        auVar22._0_4_ = auVar72._0_4_ * *(float *)(ray + 0x60);
        auVar22._8_4_ = auVar72._8_4_ * *(float *)(ray + 0x68);
        auVar22._12_4_ = auVar72._12_4_ * *(float *)(ray + 0x6c);
        auVar22._16_4_ = auVar72._16_4_ * *(float *)(ray + 0x70);
        auVar22._20_4_ = auVar72._20_4_ * *(float *)(ray + 0x74);
        auVar22._24_4_ = auVar72._24_4_ * *(float *)(ray + 0x78);
        auVar22._28_4_ = uVar9;
        auVar80._0_4_ = auVar72._0_4_ * *(float *)(ray + 0x100);
        auVar80._4_4_ = auVar72._4_4_ * *(float *)(ray + 0x104);
        auVar80._8_4_ = auVar72._8_4_ * *(float *)(ray + 0x108);
        auVar80._12_4_ = auVar72._12_4_ * *(float *)(ray + 0x10c);
        auVar80._16_4_ = auVar72._16_4_ * *(float *)(ray + 0x110);
        auVar80._20_4_ = auVar72._20_4_ * *(float *)(ray + 0x114);
        auVar80._24_4_ = auVar72._24_4_ * *(float *)(ray + 0x118);
        auVar80._28_4_ = 0;
        auVar45 = vcmpps_avx(auVar22,auVar41,1);
        auVar73 = vcmpps_avx(auVar41,auVar80,2);
        auVar45 = vandps_avx(auVar73,auVar45);
        auVar73 = auVar44 & auVar45;
        uVar34 = local_2cd0;
        if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar73 >> 0x7f,0) == '\0') &&
              (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar73 >> 0xbf,0) == '\0') &&
            (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar73[0x1f]) {
LAB_015bb257:
          auVar71._8_8_ = uStack_2bf8;
          auVar71._0_8_ = local_2c00;
          auVar71._16_8_ = uStack_2bf0;
          auVar71._24_8_ = uStack_2be8;
        }
        else {
          auVar45 = vandps_avx(auVar45,auVar44);
          auVar44 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar57),4);
          auVar73 = auVar45 & auVar44;
          if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar73 >> 0x7f,0) == '\0') &&
                (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar73 >> 0xbf,0) == '\0') &&
              (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar73[0x1f]) goto LAB_015bb257;
          auVar71 = vandps_avx(auVar44,auVar45);
          local_2b20 = ZEXT1632(auVar15);
          local_2b40 = ZEXT1632(auVar16);
          local_2b60 = ZEXT1632(auVar10);
          local_2b00 = auVar72;
          _local_2ae0 = auVar41;
          _local_2ac0 = auVar50;
          _local_2aa0 = auVar49;
        }
      }
      auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      local_2c40._0_8_ = (context->scene->geometries).items[uVar30].ptr;
      local_2c40._8_24_ = auVar65._8_24_;
      uVar36 = ((Geometry *)local_2c40._0_8_)->mask;
      auVar39._4_4_ = uVar36;
      auVar39._0_4_ = uVar36;
      auVar39._8_4_ = uVar36;
      auVar39._12_4_ = uVar36;
      auVar39._16_4_ = uVar36;
      auVar39._20_4_ = uVar36;
      auVar39._24_4_ = uVar36;
      auVar39._28_4_ = uVar36;
      auVar45 = vpand_avx2(auVar39,*(undefined1 (*) [32])(ray + 0x120));
      auVar44 = vpcmpeqd_avx2(ZEXT832(0) << 0x20,auVar45);
      auVar45 = auVar71 & ~auVar44;
      local_2c60 = auVar66;
      if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar45 >> 0x7f,0) != '\0') ||
            (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar45 >> 0xbf,0) != '\0') ||
          (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar45[0x1f] < '\0') {
        local_2c80._0_4_ = *(undefined4 *)(lVar37 + 0x10 + uVar29);
        auVar66 = vandnps_avx(auVar44,auVar71);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (((Geometry *)local_2c40._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar45 = vrcpps_avx(local_2b00);
          auVar62._8_4_ = 0x3f800000;
          auVar62._0_8_ = 0x3f8000003f800000;
          auVar62._12_4_ = 0x3f800000;
          auVar62._16_4_ = 0x3f800000;
          auVar62._20_4_ = 0x3f800000;
          auVar62._24_4_ = 0x3f800000;
          auVar62._28_4_ = 0x3f800000;
          auVar57 = vfnmadd213ps_fma(auVar45,local_2b00,auVar62);
          auVar57 = vfmadd132ps_fma(ZEXT1632(auVar57),auVar45,auVar45);
          fVar43 = auVar57._0_4_;
          fVar54 = auVar57._4_4_;
          fVar55 = auVar57._8_4_;
          fVar56 = auVar57._12_4_;
          local_2780._0_4_ = fVar43 * (float)local_2ac0._0_4_;
          local_2780._4_4_ = fVar54 * (float)local_2ac0._4_4_;
          local_2780._8_4_ = fVar55 * fStack_2ab8;
          local_2780._12_4_ = fVar56 * fStack_2ab4;
          local_2780._16_4_ = fStack_2ab0 * 0.0;
          local_2780._20_4_ = fStack_2aac * 0.0;
          local_2780._24_4_ = fStack_2aa8 * 0.0;
          local_2780._28_4_ = 0;
          local_2800._0_8_ = local_2b20._0_8_;
          local_2800._8_8_ = local_2b20._8_8_;
          local_2800._16_8_ = local_2b20._16_8_;
          local_2800._24_8_ = local_2b20._24_8_;
          local_2800._32_8_ = local_2b40._0_8_;
          local_2800._40_8_ = local_2b40._8_8_;
          local_2800._48_8_ = local_2b40._16_8_;
          local_2800._56_8_ = local_2b40._24_8_;
          local_2800._64_8_ = local_2b60._0_8_;
          local_2800._72_8_ = local_2b60._8_8_;
          local_2800._80_8_ = local_2b60._16_8_;
          local_2800._88_8_ = local_2b60._24_8_;
          local_27a0 = CONCAT44(fVar54 * (float)local_2ae0._4_4_,fVar43 * (float)local_2ae0._0_4_);
          uStack_2798 = CONCAT44(fVar56 * fStack_2ad4,fVar55 * fStack_2ad8);
          uStack_2790 = CONCAT44(fStack_2acc * 0.0,fStack_2ad0 * 0.0);
          uStack_2788 = CONCAT44(auVar45._28_4_,fStack_2ac8 * 0.0);
          local_2760._4_4_ = fVar54 * (float)local_2aa0._4_4_;
          local_2760._0_4_ = fVar43 * (float)local_2aa0._0_4_;
          fStack_2758 = fVar55 * fStack_2a98;
          fStack_2754 = fVar56 * fStack_2a94;
          fStack_2750 = fStack_2a90 * 0.0;
          fStack_274c = fStack_2a8c * 0.0;
          fStack_2748 = fStack_2a88 * 0.0;
          uStack_2744 = 0x3f800000;
          local_2cb0.valid = (int *)&local_2680;
          local_2cb0.geometryUserPtr = &local_26e0;
          local_2cb0.context = local_26c0;
          local_2cb0.ray = (RTCRayN *)&local_26a0;
          local_2cc0 = lVar33;
          local_2cb8 = lVar31;
          local_2c08 = uVar30;
          local_2a60 = auVar66;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_2cb0,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_2800.field_0);
          local_2760._4_4_ = local_2c80._0_4_;
          local_2760._0_4_ = local_2c80._0_4_;
          fStack_2758 = (float)local_2c80._0_4_;
          fStack_2754 = (float)local_2c80._0_4_;
          fStack_2750 = (float)local_2c80._0_4_;
          fStack_274c = (float)local_2c80._0_4_;
          fStack_2748 = (float)local_2c80._0_4_;
          uStack_2744 = local_2c80._0_4_;
          local_2800._0_8_ = local_2680;
          local_2800._8_8_ = uStack_2678;
          local_2800._16_8_ = uStack_2670;
          local_2800._24_8_ = uStack_2668;
          local_2800._32_8_ = local_2660;
          local_2800._40_8_ = uStack_2658;
          local_2800._48_8_ = uStack_2650;
          local_2800._56_8_ = uStack_2648;
          local_2800._64_8_ = local_2640;
          local_2800._72_8_ = uStack_2638;
          local_2800._80_8_ = uStack_2630;
          local_2800._88_8_ = uStack_2628;
          local_27a0 = local_26a0._0_8_;
          uStack_2798 = local_26a0._8_8_;
          uStack_2790 = local_26a0._16_8_;
          uStack_2788 = local_26a0._24_8_;
          local_2740 = (undefined4)local_2c08;
          uStack_273c = (undefined4)local_2c08;
          uStack_2738 = (undefined4)local_2c08;
          uStack_2734 = (undefined4)local_2c08;
          uStack_2730 = (undefined4)local_2c08;
          uStack_272c = (undefined4)local_2c08;
          uStack_2728 = (undefined4)local_2c08;
          uStack_2724 = (undefined4)local_2c08;
          auVar45 = vpcmpeqd_avx2(_local_2760,_local_2760);
          uStack_271c = context->user->instID[0];
          local_2720 = uStack_271c;
          uStack_2718 = uStack_271c;
          uStack_2714 = uStack_271c;
          uStack_2710 = uStack_271c;
          uStack_270c = uStack_271c;
          uStack_2708 = uStack_271c;
          uStack_2704 = uStack_271c;
          uStack_26fc = context->user->instPrimID[0];
          local_2700 = uStack_26fc;
          uStack_26f8 = uStack_26fc;
          uStack_26f4 = uStack_26fc;
          uStack_26f0 = uStack_26fc;
          uStack_26ec = uStack_26fc;
          uStack_26e8 = uStack_26fc;
          uStack_26e4 = uStack_26fc;
          local_2c80 = *(undefined1 (*) [32])(ray + 0x100);
          auVar66 = vblendvps_avx(local_2c80,(undefined1  [32])local_26e0,local_2a60);
          *(undefined1 (*) [32])(ray + 0x100) = auVar66;
          local_2ba0 = local_2a60;
          local_2cb0.valid = (int *)local_2ba0;
          local_2cb0.geometryUserPtr = *(void **)(local_2c40._0_8_ + 0x18);
          local_2cb0.context = context->user;
          local_2cb0.hit = (RTCHitN *)&local_2800;
          local_2cb0.N = 8;
          local_2cb0.ray = (RTCRayN *)ray;
          if (*(code **)(local_2c40._0_8_ + 0x48) != (code *)0x0) {
            (**(code **)(local_2c40._0_8_ + 0x48))(&local_2cb0);
            auVar53._8_56_ = extraout_var;
            auVar53._0_8_ = extraout_XMM1_Qa;
            auVar45 = vpcmpeqd_avx2(auVar53._0_32_,auVar53._0_32_);
          }
          auVar66 = vpcmpeqd_avx2(local_2ba0,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar44 = auVar45 & ~auVar66;
          auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar44 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar44 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar44 >> 0x7f,0) == '\0') &&
                (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar44 >> 0xbf,0) == '\0') &&
              (auVar44 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar44[0x1f]) {
            auVar66 = auVar66 ^ auVar45;
          }
          else {
            p_Var2 = context->args->filter;
            if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(local_2c40._0_8_ + 0x3e) & 0x40) != 0)
                ))) {
              (*p_Var2)(&local_2cb0);
              auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            }
            auVar45 = vpcmpeqd_avx2(local_2ba0,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            auVar66 = auVar45 ^ _DAT_01f7b020;
            auVar51._8_4_ = 0xff800000;
            auVar51._0_8_ = 0xff800000ff800000;
            auVar51._12_4_ = 0xff800000;
            auVar51._16_4_ = 0xff800000;
            auVar51._20_4_ = 0xff800000;
            auVar51._24_4_ = 0xff800000;
            auVar51._28_4_ = 0xff800000;
            auVar45 = vblendvps_avx(auVar51,*(undefined1 (*) [32])(local_2cb0.ray + 0x100),auVar45);
            *(undefined1 (*) [32])(local_2cb0.ray + 0x100) = auVar45;
          }
          auVar45 = vblendvps_avx(local_2c80,*(undefined1 (*) [32])local_2cc8,auVar66);
          *(undefined1 (*) [32])local_2cc8 = auVar45;
          lVar31 = local_2cb8;
          lVar33 = local_2cc0;
          uVar34 = local_2cd0;
        }
        auVar66 = vandnps_avx(auVar66,local_2c60);
      }
      uVar29 = uVar29 + 4;
    } while ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(auVar66 >> 0x7f,0) != '\0') ||
               (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(auVar66 >> 0xbf,0) != '\0') ||
             (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             auVar66[0x1f] < '\0');
    auVar53 = ZEXT3264(local_2bc0);
    auVar44 = vandps_avx(auVar66,local_2bc0);
    lVar33 = lVar33 + 1;
    lVar37 = lVar37 + 0x140;
    auVar66 = local_2bc0 & auVar66;
    unaff_R12 = uVar29;
    auVar45 = local_2bc0;
    local_2bc0 = auVar44;
  } while ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar66 >> 0x7f,0) != '\0') ||
             (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar66 >> 0xbf,0) != '\0') ||
           (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar66[0x1f] < '\0');
  auVar66 = vpcmpeqd_avx2(auVar45,auVar45);
  auVar42._0_4_ = local_2bc0._0_4_ ^ auVar66._0_4_;
  auVar42._4_4_ = local_2bc0._4_4_ ^ auVar66._4_4_;
  auVar42._8_4_ = local_2bc0._8_4_ ^ auVar66._8_4_;
  auVar42._12_4_ = local_2bc0._12_4_ ^ auVar66._12_4_;
  auVar42._16_4_ = local_2bc0._16_4_ ^ auVar66._16_4_;
  auVar42._20_4_ = local_2bc0._20_4_ ^ auVar66._20_4_;
  auVar42._24_4_ = local_2bc0._24_4_ ^ auVar66._24_4_;
  auVar42._28_4_ = local_2bc0._28_4_ ^ auVar66._28_4_;
  auVar23._4_4_ = uStack_2a3c;
  auVar23._0_4_ = local_2a40;
  auVar23._8_4_ = uStack_2a38;
  auVar23._12_4_ = uStack_2a34;
  auVar23._16_4_ = uStack_2a30;
  auVar23._20_4_ = uStack_2a2c;
  auVar23._24_4_ = uStack_2a28;
  auVar23._28_4_ = uStack_2a24;
  local_2be0 = vorps_avx(auVar42,auVar23);
  auVar66 = auVar66 & ~local_2be0;
  if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar66 >> 0x7f,0) == '\0') &&
        (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar66 >> 0xbf,0) == '\0') &&
      (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar66[0x1f])
  goto LAB_015bb3c5;
  auVar53 = ZEXT3264(local_2820);
  auVar63._8_4_ = 0xff800000;
  auVar63._0_8_ = 0xff800000ff800000;
  auVar63._12_4_ = 0xff800000;
  auVar63._16_4_ = 0xff800000;
  auVar63._20_4_ = 0xff800000;
  auVar63._24_4_ = 0xff800000;
  auVar63._28_4_ = 0xff800000;
  local_2820 = vblendvps_avx(local_2820,auVar63,local_2be0);
  goto LAB_015ba887;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }